

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WDString.cpp
# Opt level: O1

int index_kmp(string *S,string *T,int *next)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (S->_M_string_length == 0) {
    uVar3 = 1;
    iVar2 = 1;
  }
  else {
    iVar1 = 1;
    uVar3 = 1;
    iVar2 = 1;
    do {
      if (T->_M_string_length < (ulong)(long)iVar1) break;
      if ((iVar1 == 0) || ((S->_M_dataplus)._M_p[uVar3] == (T->_M_dataplus)._M_p[uVar3])) {
        iVar2 = iVar2 + 1;
        iVar1 = iVar1 + 1;
      }
      else {
        iVar1 = next[iVar1];
      }
      uVar3 = (ulong)iVar2;
    } while (uVar3 <= S->_M_string_length);
    uVar3 = (ulong)iVar1;
  }
  iVar1 = 0;
  if (T->_M_string_length < uVar3) {
    iVar1 = iVar2 - (int)T->_M_string_length;
  }
  return iVar1;
}

Assistant:

int index_kmp(string S,string T,int next[])
{
    int i = 1, j = 1;
    while(i<=S.length() && j <=T.length())
    {
        if(j==0||S[i]==T[i])
        {
            ++i; ++j;
        }
        else j = next[j];
    }
    return (j>T.length()? i-T.length():0);
}